

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UdpEntrySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpEntrySyntax,slang::syntax::TokenList_const&,slang::syntax::UdpEdgeIndicatorSyntax*&,slang::syntax::TokenList_const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,TokenList *args,UdpEdgeIndicatorSyntax **args_1,TokenList *args_2,
          Token *args_3,Token *args_4,Token *args_5,Token *args_6,Token *args_7)

{
  Token colon1;
  Token current;
  Token colon2;
  Token next;
  Token semi;
  UdpEntrySyntax *this_00;
  Token *args_local_4;
  Token *args_local_3;
  TokenList *args_local_2;
  UdpEdgeIndicatorSyntax **args_local_1;
  TokenList *args_local;
  BumpAllocator *this_local;
  
  this_00 = (UdpEntrySyntax *)allocate(this,200,8);
  colon1.kind = args_3->kind;
  colon1._2_1_ = args_3->field_0x2;
  colon1.numFlags.raw = (args_3->numFlags).raw;
  colon1.rawLen = args_3->rawLen;
  colon1.info = args_3->info;
  current.kind = args_4->kind;
  current._2_1_ = args_4->field_0x2;
  current.numFlags.raw = (args_4->numFlags).raw;
  current.rawLen = args_4->rawLen;
  current.info = args_4->info;
  colon2.kind = args_5->kind;
  colon2._2_1_ = args_5->field_0x2;
  colon2.numFlags.raw = (args_5->numFlags).raw;
  colon2.rawLen = args_5->rawLen;
  colon2.info = args_5->info;
  next.kind = args_6->kind;
  next._2_1_ = args_6->field_0x2;
  next.numFlags.raw = (args_6->numFlags).raw;
  next.rawLen = args_6->rawLen;
  next.info = args_6->info;
  semi.kind = args_7->kind;
  semi._2_1_ = args_7->field_0x2;
  semi.numFlags.raw = (args_7->numFlags).raw;
  semi.rawLen = args_7->rawLen;
  semi.info = args_7->info;
  slang::syntax::UdpEntrySyntax::UdpEntrySyntax
            (this_00,args,*args_1,args_2,colon1,current,colon2,next,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }